

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

tuple<pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state,_pstore::json::error_code>
 __thiscall
pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::consume_escape_state
          (string_matcher<pstore::exchange::import_ns::callbacks> *this,char32_t code_point,
          appender *app)

{
  state sVar1;
  state *psVar2;
  undefined4 uVar3;
  anon_class_1_0_00000001 decode;
  maybe<pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state,_void>
  x;
  maybe<std::tuple<char32_t,_pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state>,_void>
  local_2c;
  
  consume_escape_state::anon_class_1_0_00000001::operator()(&local_2c,&decode,code_point);
  operator>>=(&x,&local_2c,(anon_class_8_1_ba1d3581)app);
  if (x.valid_ == true) {
    psVar2 = maybe<pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state,_void>
             ::operator->(&x);
    sVar1 = *psVar2;
    uVar3 = 0;
  }
  else {
    sVar1 = normal_char_state;
    uVar3 = 9;
  }
  *(undefined4 *)&(this->super_matcher<pstore::exchange::import_ns::callbacks>)._vptr_matcher =
       uVar3;
  *(state *)((long)&(this->super_matcher<pstore::exchange::import_ns::callbacks>)._vptr_matcher + 4)
       = sVar1;
  return (tuple<pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state,_pstore::json::error_code>
          )(_Tuple_impl<0UL,_pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state,_pstore::json::error_code>
            )this;
}

Assistant:

auto string_matcher<Callbacks>::consume_escape_state (char32_t code_point,
                                                                  appender & app)
                -> std::tuple<state, error_code> {

                auto decode = [] (char32_t cp) {
                    state next_state = normal_char_state;
                    switch (cp) {
                    case '"': cp = '"'; break;
                    case '\\': cp = '\\'; break;
                    case '/': cp = '/'; break;
                    case 'b': cp = '\b'; break;
                    case 'f': cp = '\f'; break;
                    case 'n': cp = '\n'; break;
                    case 'r': cp = '\r'; break;
                    case 't': cp = '\t'; break;
                    case 'u': next_state = hex1_state; break;
                    default: return nothing<std::tuple<char32_t, state>> ();
                    }
                    return just (std::make_tuple (cp, next_state));
                };

                auto append = [&app] (std::tuple<char32_t, state> const & s) {
                    char32_t const cp = std::get<0> (s);
                    state const next_state = std::get<1> (s);
                    PSTORE_ASSERT (next_state == normal_char_state || next_state == hex1_state);
                    if (next_state == normal_char_state) {
                        if (!app.append32 (cp)) {
                            return nothing<state> ();
                        }
                    }
                    return just (next_state);
                };

                maybe<state> const x = decode (code_point) >>= append;
                return x ? std::make_tuple (*x, error_code::none)
                         : std::make_tuple (normal_char_state, error_code::invalid_escape_char);
            }